

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  bool bVar1;
  cmOutputConverter *this_00;
  char *pcVar2;
  ostream *poVar3;
  undefined1 auVar4 [16];
  allocator local_b9;
  string local_b8;
  allocator local_81;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  string dir;
  cmLocalUnixMakefileGenerator3 *lg_local;
  ostream *ruleFileStream_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  dir.field_2._8_8_ = lg;
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)lg);
  if (!bVar1) {
    this_00 = (cmOutputConverter *)(dir.field_2._8_8_ + 8);
    pcVar2 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)dir.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,pcVar2,&local_81);
    pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)dir.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,pcVar2,&local_b9);
    cmOutputConverter::ConvertToRelativePath(&local_60,this_00,&local_80,&local_b8);
    auVar4 = std::__cxx11::string::c_str();
    cmSystemTools::ConvertToOutputPath_abi_cxx11_((string *)local_40,auVar4._0_8_,auVar4._8_8_);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    cmLocalUnixMakefileGenerator3::WriteDivider
              ((cmLocalUnixMakefileGenerator3 *)dir.field_2._8_8_,ruleFileStream);
    poVar3 = std::operator<<(ruleFileStream,"# Directory level rules for directory ");
    poVar3 = std::operator<<(poVar3,(string *)local_40);
    std::operator<<(poVar3,"\n\n");
    WriteDirectoryRule2(this,ruleFileStream,(cmLocalUnixMakefileGenerator3 *)dir.field_2._8_8_,"all"
                        ,true,false);
    WriteDirectoryRule2(this,ruleFileStream,(cmLocalUnixMakefileGenerator3 *)dir.field_2._8_8_,
                        "clean",false,false);
    WriteDirectoryRule2(this,ruleFileStream,(cmLocalUnixMakefileGenerator3 *)dir.field_2._8_8_,
                        "preinstall",true,true);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  // Only subdirectories need these rules.
  if (lg->IsRootMakefile()) {
    return;
  }

  // Begin the directory-level rules section.
  std::string dir = cmSystemTools::ConvertToOutputPath(
    lg->ConvertToRelativePath(lg->GetBinaryDirectory(),
                              lg->GetCurrentBinaryDirectory())
      .c_str());
  lg->WriteDivider(ruleFileStream);
  ruleFileStream << "# Directory level rules for directory " << dir << "\n\n";

  // Write directory-level rules for "all".
  this->WriteDirectoryRule2(ruleFileStream, lg, "all", true, false);

  // Write directory-level rules for "clean".
  this->WriteDirectoryRule2(ruleFileStream, lg, "clean", false, false);

  // Write directory-level rules for "preinstall".
  this->WriteDirectoryRule2(ruleFileStream, lg, "preinstall", true, true);
}